

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O1

int acmod_process_cep(acmod_t *acmod,mfcc_t ***inout_cep,int *inout_n_frames,int full_utt)

{
  uint8 uVar1;
  int iVar2;
  int iVar3;
  int32 iVar4;
  int iVar5;
  int iVar6;
  int32 ncep;
  int32 ncep1;
  int local_40;
  int local_3c;
  mfcc_t ***local_38;
  
  if (full_utt != 0) {
    iVar3 = acmod_process_full_cep(acmod,inout_cep,inout_n_frames);
    return iVar3;
  }
  if (acmod->mfcfh != (FILE *)0x0) {
    acmod_log_mfc(acmod,*inout_cep,*inout_n_frames);
  }
  iVar3 = *inout_n_frames;
  uVar1 = acmod->state;
  if (uVar1 == '\x01') {
    iVar6 = iVar3 - acmod->fcb->window_size;
  }
  else {
    iVar6 = iVar3;
    if (uVar1 == '\x03') {
      iVar6 = acmod->fcb->window_size + iVar3;
    }
  }
  iVar5 = acmod->n_feat_alloc - acmod->n_feat_frame;
  local_40 = iVar3;
  if (iVar5 < iVar6) {
    if ((uVar1 == '\x03') || (acmod->grow_feat != '\0')) {
      acmod_grow_feat_buf(acmod,acmod->n_feat_alloc + iVar6);
    }
    else {
      local_40 = (iVar3 - iVar6) + iVar5;
    }
  }
  iVar5 = acmod->n_feat_frame + acmod->feat_outidx;
  if (acmod->grow_feat == '\0') {
    iVar5 = iVar5 % acmod->n_feat_alloc;
  }
  else {
    local_38 = inout_cep;
    while (inout_cep = local_38, acmod->n_feat_alloc <= iVar5 + iVar6) {
      acmod_grow_feat_buf(acmod,acmod->n_feat_alloc * 2);
    }
  }
  iVar2 = acmod->n_feat_alloc;
  if (iVar2 < iVar6 + iVar5) {
    if (acmod->state == '\x03') {
      *inout_n_frames = *inout_n_frames - local_40;
      *inout_cep = *inout_cep + local_40;
      return 0;
    }
    if (iVar2 < iVar6 + iVar5) {
      local_3c = iVar2 - iVar5;
      iVar4 = feat_s2mfc2feat_live
                        (acmod->fcb,*inout_cep,&local_3c,(uint)(acmod->state == '\x01'),0,
                         acmod->feat_buf + iVar5);
      if (-1 < iVar4) {
        iVar6 = acmod->n_feat_frame + iVar4;
        acmod->n_feat_frame = iVar6;
        if (acmod->n_feat_alloc < iVar6) {
          __assert_fail("acmod->n_feat_frame <= acmod->n_feat_alloc",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                        ,0x2e3,"int acmod_process_cep(acmod_t *, mfcc_t ***, int *, int)");
        }
        iVar5 = (iVar5 + iVar4) % acmod->n_feat_alloc;
        *inout_n_frames = *inout_n_frames - local_3c;
        *inout_cep = *inout_cep + local_3c;
        local_40 = local_40 - local_3c;
      }
      if (iVar4 < 0) {
        return -1;
      }
    }
  }
  iVar4 = feat_s2mfc2feat_live
                    (acmod->fcb,*inout_cep,&local_40,(uint)(acmod->state == '\x01'),
                     (uint)(acmod->state == '\x03'),acmod->feat_buf + iVar5);
  if (iVar4 < 0) {
    return -1;
  }
  iVar6 = iVar4 + acmod->n_feat_frame;
  acmod->n_feat_frame = iVar6;
  if (acmod->n_feat_alloc < iVar6) {
    __assert_fail("acmod->n_feat_frame <= acmod->n_feat_alloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                  ,0x2f4,"int acmod_process_cep(acmod_t *, mfcc_t ***, int *, int)");
  }
  iVar6 = *inout_n_frames;
  *inout_n_frames = iVar6 - local_40;
  *inout_cep = *inout_cep + local_40;
  if (acmod->state == '\x01') {
    acmod->state = '\x02';
  }
  return iVar3 - (iVar6 - local_40);
}

Assistant:

int
acmod_process_cep(acmod_t *acmod,
                  mfcc_t ***inout_cep,
                  int *inout_n_frames,
                  int full_utt)
{
    int32 nfeat, ncep, inptr;
    int orig_n_frames;

    /* If this is a full utterance, process it all at once. */
    if (full_utt)
        return acmod_process_full_cep(acmod, inout_cep, inout_n_frames);

    /* Write to log file. */
    if (acmod->mfcfh)
        acmod_log_mfc(acmod, *inout_cep, *inout_n_frames);

    /* Maximum number of frames we're going to generate. */
    orig_n_frames = ncep = nfeat = *inout_n_frames;

    /* FIXME: This behaviour isn't guaranteed... */
    if (acmod->state == ACMOD_ENDED)
        nfeat += feat_window_size(acmod->fcb);
    else if (acmod->state == ACMOD_STARTED)
        nfeat -= feat_window_size(acmod->fcb);

    /* Clamp number of features to fit available space. */
    if (nfeat > acmod->n_feat_alloc - acmod->n_feat_frame) {
        /* Grow it as needed - we have to grow it at the end of an
         * utterance because we can't return a short read there. */
        if (acmod->grow_feat || acmod->state == ACMOD_ENDED)
            acmod_grow_feat_buf(acmod, acmod->n_feat_alloc + nfeat);
        else
            ncep -= (nfeat - (acmod->n_feat_alloc - acmod->n_feat_frame));
    }

    /* Where to start writing in the feature buffer. */
    if (acmod->grow_feat) {
        /* Grow to avoid wraparound if grow_feat == TRUE. */
        inptr = acmod->feat_outidx + acmod->n_feat_frame;
        while (inptr + nfeat >= acmod->n_feat_alloc)
            acmod_grow_feat_buf(acmod, acmod->n_feat_alloc * 2);
    }
    else {
        inptr = (acmod->feat_outidx + acmod->n_feat_frame) % acmod->n_feat_alloc;
    }


    /* FIXME: we can't split the last frame drop properly to be on the boundary, so just return */
    if (inptr + nfeat > acmod->n_feat_alloc && acmod->state == ACMOD_ENDED) {
	*inout_n_frames -= ncep;
	*inout_cep += ncep;
	return 0;
    }

    /* Write them in two parts if there is wraparound. */
    if (inptr + nfeat > acmod->n_feat_alloc) {
        int32 ncep1 = acmod->n_feat_alloc - inptr;

        /* Make sure we don't end the utterance here. */
        nfeat = feat_s2mfc2feat_live(acmod->fcb, *inout_cep,
                                     &ncep1,
                                     (acmod->state == ACMOD_STARTED),
                                     FALSE,
                                     acmod->feat_buf + inptr);
        if (nfeat < 0)
            return -1;
        /* Move the output feature pointer forward. */
        acmod->n_feat_frame += nfeat;
        assert(acmod->n_feat_frame <= acmod->n_feat_alloc);
        inptr += nfeat;
        inptr %= acmod->n_feat_alloc;
        /* Move the input feature pointers forward. */
        *inout_n_frames -= ncep1;
        *inout_cep += ncep1;
        ncep -= ncep1;
    }

    nfeat = feat_s2mfc2feat_live(acmod->fcb, *inout_cep,
                                 &ncep,
                                 (acmod->state == ACMOD_STARTED),
                                 (acmod->state == ACMOD_ENDED),
                                 acmod->feat_buf + inptr);
    if (nfeat < 0)
        return -1;
    acmod->n_feat_frame += nfeat;
    assert(acmod->n_feat_frame <= acmod->n_feat_alloc);
    /* Move the input feature pointers forward. */
    *inout_n_frames -= ncep;
    *inout_cep += ncep;
    if (acmod->state == ACMOD_STARTED)
        acmod->state = ACMOD_PROCESSING;
    return orig_n_frames - *inout_n_frames;
}